

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void stbi__pnm_skip_whitespace(stbi__context *s,char *c)

{
  stbi_uc sVar1;
  int iVar2;
  
  while( true ) {
    while( true ) {
      iVar2 = stbi__at_eof(s);
      if (((iVar2 != 0) || (0x20 < (ulong)(byte)*c)) ||
         ((0x100003e00U >> ((ulong)(byte)*c & 0x3f) & 1) == 0)) break;
      sVar1 = stbi__get8(s);
      *c = sVar1;
    }
    iVar2 = stbi__at_eof(s);
    if ((iVar2 != 0) || (*c != '#')) break;
    while( true ) {
      iVar2 = stbi__at_eof(s);
      if (((iVar2 != 0) || (*c == '\n')) || (*c == '\r')) break;
      sVar1 = stbi__get8(s);
      *c = sVar1;
    }
  }
  return;
}

Assistant:

static void     stbi__pnm_skip_whitespace(stbi__context *s, char *c)
{
   for (;;) {
      while (!stbi__at_eof(s) && stbi__pnm_isspace(*c))
         *c = (char) stbi__get8(s);

      if (stbi__at_eof(s) || *c != '#')
         break;

      while (!stbi__at_eof(s) && *c != '\n' && *c != '\r' )
         *c = (char) stbi__get8(s);
   }
}